

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O1

RPCHelpMan * createpsbt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string m_key_name;
  RPCResult result;
  string description;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  undefined1 auVar2 [24];
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  code *pcVar3;
  undefined8 in_stack_fffffffffffffdf0;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  undefined1 in_stack_fffffffffffffe10 [16];
  _Vector_impl_data in_stack_fffffffffffffe20;
  pointer in_stack_fffffffffffffe38;
  _Alloc_hider in_stack_fffffffffffffe40;
  _Alloc_hider _Var7;
  size_type in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  string local_1a0;
  string local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"createpsbt","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nCreates a transaction in the Partially Signed Transaction format.\nImplements the Creator role.\n"
             ,"");
  CreateTxDoc();
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"The resulting raw transaction (base64-encoded string)","");
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffdd0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdc8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffde0;
  auVar2._16_8_ = 0;
  auVar2._0_16_ = in_stack_fffffffffffffe10;
  RPCResult::RPCResult
            (&local_100,STR,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar2 << 0x40),SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdd0;
  result._0_8_ = in_stack_fffffffffffffdc8;
  result.m_key_name._M_string_length = in_stack_fffffffffffffdd8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffde0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffde8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdf0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar4;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar5;
  result._64_8_ = pRVar6;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe10._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffffe10._8_8_;
  result._88_24_ = in_stack_fffffffffffffe20;
  result.m_cond._M_string_length = (size_type)in_stack_fffffffffffffe38;
  result.m_cond.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe40._M_p;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffe48;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffe10,result);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"createpsbt","");
  _Var7._M_p = &stack0xfffffffffffffe50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe40,
             "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"data\\\":\\\"00010203\\\"}]\""
             ,"");
  HelpExampleCli(&local_180,&local_1a0,(string *)&stack0xfffffffffffffe40);
  paVar1 = &local_180.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == paVar1) {
    local_150._8_8_ = local_180.field_2._8_8_;
    local_160 = &local_150;
  }
  else {
    local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p;
  }
  local_150._M_allocated_capacity._1_7_ = local_180.field_2._M_allocated_capacity._1_7_;
  local_150._M_local_buf[0] = local_180.field_2._M_local_buf[0];
  local_158 = local_180._M_string_length;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  pcVar3 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1580:9)>
           ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1580:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1580:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar4;
  description.field_2._8_8_ = pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffffe10._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffe10._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar6;
  examples.m_examples._M_string_length = (size_type)_Var7._M_p;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38;
  examples.m_examples.field_2._M_allocated_capacity = in_stack_fffffffffffffe48;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffe50;
  local_180._M_dataplus._M_p = (pointer)paVar1;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffdd0,&stack0xfffffffffffffdd8)),
             description,args,(RPCResults)in_stack_fffffffffffffe20,examples,
             (RPCMethodImpl *)&local_58);
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(&stack0xfffffffffffffdd8,&stack0xfffffffffffffdd8,3);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar1) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  if (_Var7._M_p != &stack0xfffffffffffffe50) {
    operator_delete(_Var7._M_p,in_stack_fffffffffffffe50 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffe10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffdf8);
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffe28);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan createpsbt()
{
    return RPCHelpMan{"createpsbt",
                "\nCreates a transaction in the Partially Signed Transaction format.\n"
                "Implements the Creator role.\n",
                CreateTxDoc(),
                RPCResult{
                    RPCResult::Type::STR, "", "The resulting raw transaction (base64-encoded string)"
                },
                RPCExamples{
                    HelpExampleCli("createpsbt", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"data\\\":\\\"00010203\\\"}]\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{

    std::optional<bool> rbf;
    if (!request.params[3].isNull()) {
        rbf = request.params[3].get_bool();
    }
    CMutableTransaction rawTx = ConstructTransaction(request.params[0], request.params[1], request.params[2], rbf);

    // Make a blank psbt
    PartiallySignedTransaction psbtx;
    psbtx.tx = rawTx;
    for (unsigned int i = 0; i < rawTx.vin.size(); ++i) {
        psbtx.inputs.emplace_back();
    }
    for (unsigned int i = 0; i < rawTx.vout.size(); ++i) {
        psbtx.outputs.emplace_back();
    }

    // Serialize the PSBT
    DataStream ssTx{};
    ssTx << psbtx;

    return EncodeBase64(ssTx);
},
    };
}